

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O3

int streamWrapper(void *ptr,mpt_message *msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  char *pcVar6;
  size_t *psVar7;
  char *pcVar8;
  ulong uVar9;
  mpt_reply_context *rc;
  mpt_reply_data *rd;
  uint64_t mid;
  mpt_msgtype hdr;
  mpt_event ev;
  uint8_t id [255];
  undefined8 *local_188;
  long local_180;
  undefined8 local_178;
  undefined1 local_16a;
  undefined1 local_169;
  undefined8 *local_168;
  mpt_message *pmStack_160;
  undefined8 local_158;
  size_t local_148;
  undefined1 *puStack_140;
  iovec *local_138;
  size_t sStack_130;
  byte local_128 [264];
  
  local_168 = (undefined8 *)0x0;
  local_158 = 0;
  lVar4 = *ptr;
  uVar9 = (ulong)*(byte *)(lVar4 + 0xd);
  if (uVar9 == 0) {
    if (*(code **)((long)ptr + 8) != (code *)0x0) {
      pmStack_160 = msg;
      iVar2 = (**(code **)((long)ptr + 8))(*(undefined8 *)((long)ptr + 0x10),&local_168);
      return iVar2;
    }
LAB_00104b1a:
    iVar2 = 0;
  }
  else {
    pmStack_160 = (mpt_message *)&local_148;
    local_148 = msg->used;
    puStack_140 = (undefined1 *)msg->base;
    local_138 = msg->cont;
    sStack_130 = msg->clen;
    uVar3 = mpt_message_read(pmStack_160,uVar9,local_128);
    if (uVar3 < uVar9) {
      pcVar6 = "%s: %s";
      pcVar8 = "message id incomplete";
    }
    else {
      if (-1 < (char)local_128[0]) {
        uVar3 = 0;
        do {
          if (local_128[uVar3] != 0) {
            puVar5 = *(undefined8 **)(lVar4 + 0x20);
            if (puVar5 == (undefined8 *)0x0) {
              puVar5 = (undefined8 *)mpt_reply_deferrable(uVar9,replyConnection,lVar4);
              if (puVar5 == (undefined8 *)0x0) {
                mpt_message_buf2id(local_128,uVar9,&local_178);
                mpt_log(0,"mpt::connection::dispatch<mpt::stream>",4,"%s: %s (%08lx)",
                        "dispatch incomplete","no context available",local_178);
                break;
              }
              *(undefined8 **)(lVar4 + 0x20) = puVar5;
            }
            local_188 = (undefined8 *)0x0;
            local_180 = 0;
            iVar2 = (**(code **)*puVar5)(puVar5,8);
            if ((iVar2 < 0) || (local_180 == 0)) {
              local_168 = (undefined8 *)0x0;
            }
            else {
              (**(code **)*puVar5)(puVar5,0x82,&local_188);
              local_168 = local_188;
              if ((local_188 != (undefined8 *)0x0) &&
                 (iVar2 = mpt_reply_set(local_180,uVar9,local_128), iVar2 < 0)) {
                mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                        "context not ready");
                return -4;
              }
            }
            goto LAB_00104ab2;
          }
          uVar3 = uVar3 + 1;
        } while (uVar9 != uVar3);
        local_188 = (undefined8 *)0x0;
        local_180 = 0;
        local_168 = (undefined8 *)0x0;
LAB_00104ab2:
        if (*(code **)((long)ptr + 8) != (code *)0x0) {
          iVar2 = (**(code **)((long)ptr + 8))(*(undefined8 *)((long)ptr + 0x10),&local_168);
          if (local_188 == (undefined8 *)0x0) {
            return iVar2;
          }
          if (*(short *)(local_180 + 2) == 0) {
            return iVar2;
          }
          puStack_140 = &local_16a;
          local_16a = 1;
          local_169 = (undefined1)iVar2;
          psVar7 = &local_148;
          local_148 = 2;
          local_138 = (iovec *)0x0;
          sStack_130 = 0;
          puVar5 = (undefined8 *)*local_188;
LAB_00104b16:
          (*(code *)*puVar5)(local_188,psVar7);
          return iVar2;
        }
        if (local_188 != (undefined8 *)0x0) {
          puVar5 = (undefined8 *)*local_188;
          iVar2 = 0;
          psVar7 = (size_t *)0x0;
          goto LAB_00104b16;
        }
        goto LAB_00104b1a;
      }
      local_128[0] = local_128[0] & 0x7f;
      uVar1 = mpt_message_buf2id(local_128,uVar9,&local_178);
      if (8 < uVar1) {
        mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                "reply id invalid");
      }
      lVar4 = mpt_command_get(lVar4 + 0x18,local_178);
      if (lVar4 != 0) {
        iVar2 = (**(code **)(lVar4 + 8))(*(undefined8 *)(lVar4 + 0x10),&local_148);
        return iVar2;
      }
      pcVar6 = "%s: %s (%08lx)";
      pcVar8 = "unknown reply id";
    }
    mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,pcVar6,"dispatch failed",pcVar8);
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int streamWrapper(void *ptr, const MPT_STRUCT(message) *msg)
{
	const struct _streamWrapper *wd = ptr;
	MPT_STRUCT(reply_data) *rd;
	MPT_STRUCT(reply_context) *rc;
	MPT_STRUCT(connection) *con;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	uint8_t idlen;
	
	con = wd->con;
	
	/* default to one-way processing */
	if (!(idlen = con->out._idlen)) {
		if (!wd->cmd) {
			return 0;
		}
		ev.msg = msg;
		return wd->cmd(wd->arg, &ev);
	}
	else {
		static const char _func[] = "mpt::connection::dispatch<mpt::stream>";
		MPT_STRUCT(message) tmp;
		uint64_t mid;
		uint8_t id[UINT8_MAX], i;
		MPT_STRUCT(metatype) *ctx;
		int ret;
		
		/* consume message ID */
		ev.msg = &tmp;
		tmp = *msg;
		if ((mpt_message_read(&tmp, idlen, id)) < idlen) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("message id incomplete"));
			return MPT_ERROR(BadValue);
		}
		/* test reply indicator */
		if (id[0] & 0x80) {
			MPT_STRUCT(command) *ans;
			
			id[0] &= 0x7f;
			if ((ret = mpt_message_buf2id(id, idlen, &mid)) < 0
			    || ret > (int) sizeof(ans->id)) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
				        MPT_tr("dispatch failed"), MPT_tr("reply id invalid"));
			}
			/* find reply handler */
			if (!(ans = mpt_command_get(&con->_wait, mid))) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s (%08" PRIx64 ")",
				        MPT_tr("dispatch failed"), MPT_tr("unknown reply id"), mid);
				return MPT_ERROR(BadValue);
			}
			return ans->cmd(ans->arg, &tmp);
		}
		ctx = 0;
		for (i = 0; i < idlen; ++i) {
			/* skip zero elements */
			if (!id[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if ((ctx = mpt_reply_deferrable(idlen, replyConnection, con))) {
				con->_rctx = ctx;
				break;
			}
			mpt_message_buf2id(id, idlen, &mid);
			mpt_log(0, _func, MPT_LOG(Warning), "%s: %s (%08" PRIx64 ")",
			        MPT_tr("dispatch incomplete"), MPT_tr("no context available"), mid);
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, idlen, id) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		if (!wd->cmd) {
			if (rc) {
				rc->_vptr->reply(rc, 0);
			}
			return 0;
		}
		ret = wd->cmd(wd->arg, &ev);
		/* generic reply to failed command */
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			tmp.base = &hdr;
			tmp.used = sizeof(hdr);
			tmp.cont = 0;
			tmp.clen = 0;
			rc->_vptr->reply(rc, &tmp);
		}
		return ret;
	}
}